

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> * __thiscall
el::base::TypedConfigurations::unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
          (TypedConfigurations *this,Level level,
          unordered_map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
          *confMap,char *confName)

{
  bool bVar1;
  pointer ppVar2;
  key_type local_44;
  _Node_iterator_base<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
  local_38;
  iterator it;
  char *confName_local;
  unordered_map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  *confMap_local;
  TypedConfigurations *pTStack_18;
  Level level_local;
  TypedConfigurations *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
               )confName;
  confMap_local._4_4_ = level;
  pTStack_18 = this;
  local_38._M_cur =
       (__node_type *)
       utils::std::
       unordered_map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
       ::find(confMap,(key_type *)((long)&confMap_local + 4));
  local_40._M_cur =
       (__node_type *)
       utils::std::
       unordered_map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
       ::end(confMap);
  bVar1 = utils::std::__detail::operator==(&local_38,&local_40);
  if (bVar1) {
    local_44 = Global;
    this_local = (TypedConfigurations *)
                 utils::std::
                 unordered_map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
                 ::at(confMap,&local_44);
  }
  else {
    ppVar2 = utils::std::__detail::
             _Node_iterator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_false,_true>
                           *)&local_38);
    this_local = (TypedConfigurations *)&ppVar2->second;
  }
  return (shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)this_local;
}

Assistant:

Conf_T& unsafeGetConfigByRef(Level level, std::unordered_map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::unordered_map<Level, Conf_T>::iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
      }
    }
    return it->second;
  }